

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

bool __thiscall cmNinjaTargetGenerator::NeedDepTypeMSVC(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *this_00;
  int iVar1;
  char *__s1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::operator+(&local_30,"CMAKE_NINJA_DEPTYPE_",lang);
  __s1 = cmMakefile::GetSafeDefinition(this_00,&local_30);
  iVar1 = strcmp(__s1,"msvc");
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1 == 0;
}

Assistant:

bool cmNinjaTargetGenerator::NeedDepTypeMSVC(const std::string& lang) const
{
  return strcmp(this->GetMakefile()->GetSafeDefinition("CMAKE_NINJA_DEPTYPE_" +
                                                       lang),
                "msvc") == 0;
}